

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::~basic_cbor_encoder
          (basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
           *this)

{
  cbor_encode_options *in_RDI;
  vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
  *unaff_retaddr;
  
  bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::flush((bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *)&in_RDI->use_stringref_);
  std::
  map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
  ::~map((map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
          *)0x29567d);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *)0x29568b);
  std::
  vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
  ::~vector(unaff_retaddr);
  std::allocator<char>::~allocator((allocator<char> *)&in_RDI[1].field_0x10);
  cbor_encode_options::~cbor_encode_options(in_RDI);
  basic_json_visitor<char>::~basic_json_visitor((basic_json_visitor<char> *)in_RDI);
  return;
}

Assistant:

~basic_cbor_encoder() noexcept
    {
        JSONCONS_TRY
        {
            sink_.flush();
        }